

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::GridDataType0::GridDataType0(GridDataType0 *this,KDataStream *stream)

{
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType0_00311b38;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Decode(this,stream);
  return;
}

Assistant:

GridDataType0::GridDataType0(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}